

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

void lex_match(LexState *ls,LexToken what,LexToken who,BCLine line)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  uint in_ECX;
  LexState *in_RDI;
  char *swho;
  char *swhat;
  LexState *in_stack_ffffffffffffffd8;
  LexState *in_stack_ffffffffffffffe0;
  
  iVar1 = lex_opt(in_stack_ffffffffffffffd8,0);
  if (iVar1 != 0) {
    return;
  }
  if (in_ECX == in_RDI->linenumber) {
    err_token(in_stack_ffffffffffffffe0,(LexToken)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
  }
  pcVar2 = lj_lex_token2str(in_stack_ffffffffffffffd8,0);
  pcVar3 = lj_lex_token2str(in_stack_ffffffffffffffd8,0);
  lj_lex_error(in_RDI,(LexToken)(ulong)(uint)in_RDI->tok,LJ_ERR_XMATCH,pcVar2,pcVar3,(ulong)in_ECX);
}

Assistant:

static void lex_match(LexState *ls, LexToken what, LexToken who, BCLine line)
{
  if (!lex_opt(ls, what)) {
    if (line == ls->linenumber) {
      err_token(ls, what);
    } else {
      const char *swhat = lj_lex_token2str(ls, what);
      const char *swho = lj_lex_token2str(ls, who);
      lj_lex_error(ls, ls->tok, LJ_ERR_XMATCH, swhat, swho, line);
    }
  }
}